

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

UBool icu_63::util_equalSubstitutions(NFSubstitution *sub1,NFSubstitution *sub2)

{
  int iVar1;
  NFSubstitution *sub2_local;
  NFSubstitution *sub1_local;
  
  if (sub1 == (NFSubstitution *)0x0) {
    if (sub2 == (NFSubstitution *)0x0) {
      return '\x01';
    }
  }
  else if (sub2 != (NFSubstitution *)0x0) {
    iVar1 = (*(sub1->super_UObject)._vptr_UObject[3])(sub1,sub2);
    return (UBool)iVar1;
  }
  return '\0';
}

Assistant:

static UBool
util_equalSubstitutions(const NFSubstitution* sub1, const NFSubstitution* sub2)
{
    if (sub1) {
        if (sub2) {
            return *sub1 == *sub2;
        }
    } else if (!sub2) {
        return TRUE;
    }
    return FALSE;
}